

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_SubDEdgePtr __thiscall
ON_SubDMeshFragment::SubDEdgePtr(ON_SubDMeshFragment *this,uint grid_side_index)

{
  ushort uVar1;
  ushort uVar2;
  ON_SubDFace *this_00;
  bool bVar3;
  ON_SubDEdgePtr OVar4;
  uint i;
  
  this_00 = this->m_face;
  if (this_00 == (ON_SubDFace *)0x0) {
    return (ON_SubDEdgePtr)0;
  }
  uVar1 = this_00->m_edge_count;
  if (3 < grid_side_index || uVar1 < 3) {
    return (ON_SubDEdgePtr)0;
  }
  i = (uint)this->m_face_vertex_index[grid_side_index];
  if (uVar1 <= this->m_face_vertex_index[grid_side_index]) {
    uVar2 = this->m_face_vertex_index[grid_side_index + 1 & 3];
    OVar4.m_ptr = (ON__UINT_PTR)uVar2;
    if (uVar1 <= uVar2) {
      bVar3 = true;
      goto LAB_00613cfa;
    }
    i = (((uint)uVar2 + (uint)uVar1) - 1) % (uint)uVar1;
  }
  OVar4 = ON_SubDFace::EdgePtr(this_00,i);
  bVar3 = false;
LAB_00613cfa:
  if (bVar3) {
    return (ON_SubDEdgePtr)0;
  }
  return (ON_SubDEdgePtr)OVar4.m_ptr;
}

Assistant:

const class ON_SubDEdgePtr ON_SubDMeshFragment::SubDEdgePtr(
  unsigned int grid_side_index
  ) const
{
  const unsigned int grid_side_count = 4; // will be 3 for a tri sub-D
  if (nullptr != m_face &&  m_face->m_edge_count >= 3 && grid_side_index < grid_side_count)
  {
    unsigned short fei = m_face_vertex_index[grid_side_index];
    if (fei < m_face->m_edge_count)
      return m_face->EdgePtr(fei);
    fei = m_face_vertex_index[(grid_side_index+1) % grid_side_count];
    if (fei < m_face->m_edge_count)
      return m_face->EdgePtr((fei+m_face->m_edge_count-1) % m_face->m_edge_count);
  }
  return ON_SubDEdgePtr::Null;
}